

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_context_set_illegal_callback
               (secp256k1_context *ctx,_func_void_char_ptr_void_ptr *fun,void *data)

{
  char *in_RDX;
  code *in_RSI;
  secp256k1_context *in_RDI;
  
  if (in_RDI == &secp256k1_context_static_) {
    secp256k1_callback_call((secp256k1_callback *)in_RSI,in_RDX);
  }
  else {
    if ((secp256k1_callback *)in_RSI == (secp256k1_callback *)0x0) {
      in_RSI = secp256k1_default_illegal_callback_fn;
    }
    (in_RDI->illegal_callback).fn = in_RSI;
    (in_RDI->illegal_callback).data = in_RDX;
  }
  return;
}

Assistant:

void secp256k1_context_set_illegal_callback(secp256k1_context* ctx, void (*fun)(const char* message, void* data), const void* data) {
    /* We compare pointers instead of checking secp256k1_context_is_proper() here
       because setting callbacks is allowed on *copies* of the static context:
       it's harmless and makes testing easier. */
    ARG_CHECK_VOID(ctx != secp256k1_context_static);
    if (fun == NULL) {
        fun = secp256k1_default_illegal_callback_fn;
    }
    ctx->illegal_callback.fn = fun;
    ctx->illegal_callback.data = data;
}